

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

bool __thiscall
chaiscript::dispatch::Proxy_Function_Base::filter
          (Proxy_Function_Base *this,Function_Params *vals,Type_Conversions_State *t_conversions)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = this->m_arity;
  if (iVar1 == -1) {
    bVar2 = true;
  }
  else {
    if ((iVar1 < 1) || (iVar1 != (int)((ulong)((long)vals->m_end - (long)vals->m_begin) >> 4))) {
      __assert_fail("m_arity == -1 || (m_arity > 0 && static_cast<int>(vals.size()) == m_arity)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/proxy_functions.hpp"
                    ,0xcf,
                    "bool chaiscript::dispatch::Proxy_Function_Base::filter(const Function_Params &, const Type_Conversions_State &) const"
                   );
    }
    bVar2 = compare_type_to_param
                      ((this->m_types).
                       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,vals->m_begin,t_conversions);
    if (bVar2 && iVar1 != 1) {
      bVar2 = compare_type_to_param
                        ((this->m_types).
                         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2,vals->m_begin + 1,
                         t_conversions);
      return bVar2;
    }
    bVar2 = iVar1 == 1 && bVar2;
  }
  return bVar2;
}

Assistant:

bool filter(const Function_Params &vals, const Type_Conversions_State &t_conversions) const noexcept {
        assert(m_arity == -1 || (m_arity > 0 && static_cast<int>(vals.size()) == m_arity));

        if (m_arity < 0) {
          return true;
        } else if (m_arity > 1) {
          return compare_type_to_param(m_types[1], vals[0], t_conversions) && compare_type_to_param(m_types[2], vals[1], t_conversions);
        } else {
          return compare_type_to_param(m_types[1], vals[0], t_conversions);
        }
      }